

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O3

void __thiscall
sai::VirtualFileSystem::IterateFATBlock
          (VirtualFileSystem *this,size_t PageIndex,VirtualFileVisitor *Visitor)

{
  _Atomic_word *p_Var1;
  EntryType EVar2;
  int iVar3;
  size_t PageIndex_00;
  long lVar4;
  ulong PageIndex_01;
  long lVar5;
  VirtualPage TablePage;
  VirtualPage CurPage;
  weak_ptr<sai::ifstream> local_2060;
  long local_2050;
  size_t local_2048;
  VirtualFileEntry local_2030 [39];
  FATEntry local_1030 [64];
  
  lVar5 = 0;
  memset(local_1030,0,0x1000);
  local_2050 = PageIndex << 0xc;
  local_2048 = PageIndex;
  std::istream::seekg((long)(this->FileStream).
                            super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (_Ios_Seekdir)local_2050);
  std::istream::read((char *)(this->FileStream).
                             super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)local_1030);
  do {
    if (*(int *)(local_1030[0].Name + lVar5 + -4) == 0) break;
    local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->FileStream).super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->FileStream).super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count =
             (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count =
             (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_weak_count + 1;
      }
    }
    VirtualFileEntry::VirtualFileEntry
              (local_2030,&local_2060,(FATEntry *)(local_1030[0].Name + lVar5 + -4));
    if (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_weak_count;
        (local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_2060.super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_vptr__Sp_counted_base[3])();
      }
    }
    EVar2 = VirtualFileEntry::GetType(local_2030);
    if (EVar2 == Folder) {
      (**(code **)(*(long *)Visitor + 0x10))(Visitor,local_2030);
      PageIndex_00 = VirtualFileEntry::GetPageIndex(local_2030);
      lVar4 = 0x18;
      IterateFATBlock(this,PageIndex_00,Visitor);
LAB_00108531:
      (**(code **)(*(long *)Visitor + lVar4))(Visitor);
    }
    else {
      lVar4 = 0x20;
      if (EVar2 == File) goto LAB_00108531;
    }
    VirtualFileEntry::~VirtualFileEntry(local_2030);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x1000);
  memset(local_2030,0,0x1000);
  std::istream::seekg((long)(this->FileStream).
                            super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (_Ios_Seekdir)local_2050 & 0xffe00000);
  std::istream::read((char *)(this->FileStream).
                             super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)local_2030);
  PageIndex_01 = (ulong)*(uint *)(local_2030[0].FATData.Name + (ulong)((uint)local_2048 & 0x1ff) * 8
                                 );
  if (PageIndex_01 != 0) {
    IterateFATBlock(this,PageIndex_01,Visitor);
  }
  return;
}

Assistant:

void VirtualFileSystem::IterateFATBlock(std::size_t PageIndex, VirtualFileVisitor& Visitor)
{
	VirtualPage CurPage = {};
	Read(PageIndex * VirtualPage::PageSize, CurPage);

	for( const FATEntry& CurFATEntry : CurPage.FATEntries )
	{
		if( !CurFATEntry.Flags )
		{
			break;
		}

		VirtualFileEntry CurEntry(FileStream, CurFATEntry);
		switch( CurEntry.GetType() )
		{
		case FATEntry::EntryType::File:
		{
			Visitor.VisitFile(CurEntry);
			break;
		}
		case FATEntry::EntryType::Folder:
		{
			Visitor.VisitFolderBegin(CurEntry);
			IterateFATBlock(CurEntry.GetPageIndex(), Visitor);
			Visitor.VisitFolderEnd(CurEntry);
			break;
		}
		}
	}

	VirtualPage TablePage = {};
	Read(VirtualPage::NearestTableIndex(PageIndex) * VirtualPage::PageSize, TablePage);

	if( TablePage.PageEntries[PageIndex % VirtualPage::TableSpan].NextPageIndex )
	{
		IterateFATBlock(
			TablePage.PageEntries[PageIndex % VirtualPage::TableSpan].NextPageIndex, Visitor
		);
	}
}